

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::
ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
::ConvertOne(ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
             *this,UnboundConversion *conv,string_view conv_string)

{
  bool bVar1;
  ostream *poVar2;
  char cVar3;
  Flags v;
  string_view v_00;
  BoundConversion bound;
  UntypedFormatSpecImpl spec;
  ostringstream ss;
  BoundConversion local_240;
  string local_228;
  Streamable local_208;
  UntypedFormatSpecImpl local_1b8;
  Data local_1a8;
  Data DStack_1a0;
  FormatArgImpl local_198 [7];
  ios_base local_128 [264];
  
  local_240.super_FormatConversionSpecImpl.conv_ = v|s;
  local_240.super_FormatConversionSpecImpl.length_mod_ = none;
  bVar1 = ArgContext::Bind(&this->arg_context_,conv,&local_240);
  if (bVar1) {
    local_1b8.data_ = "%d";
    local_1b8.size_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{",1);
    local_1a8 = (local_240.arg_)->data_;
    DStack_1a0 = *(Data *)((long)local_240.arg_ + 8);
    local_208.format_ = &local_1b8;
    InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::InlinedVector<const_absl::lts_20250127::str_format_internal::FormatArgImpl_*,_0>
              (&local_208.args_,(FormatArgImpl *)&local_1a8,local_198,(allocator_type *)&local_228);
    Streamable::Print(&local_208,(ostream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    FlagsToString_abi_cxx11_
              (&local_228,
               (str_format_internal *)(ulong)local_240.super_FormatConversionSpecImpl.flags_,v);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_228._M_dataplus._M_p,local_228._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (((byte)local_208.args_.storage_.metadata_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
               .super_Storage<unsigned_long,_1UL,_false>.value & 1) != 0) {
      operator_delete(local_208.args_.storage_.data_.allocated.allocated_data,
                      local_208.args_.storage_.data_.allocated.allocated_capacity << 4);
    }
    if (-1 < local_240.super_FormatConversionSpecImpl.width_) {
      std::ostream::operator<<(local_198,local_240.super_FormatConversionSpecImpl.width_);
    }
    if (-1 < local_240.super_FormatConversionSpecImpl.precision_) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".",1);
      std::ostream::operator<<(local_198,local_240.super_FormatConversionSpecImpl.precision_);
    }
    cVar3 = '?';
    if ((ulong)local_240.super_FormatConversionSpecImpl.conv_ < 0x13) {
      cVar3 = "csdiouxXfFeEgGaAnpv"[local_240.super_FormatConversionSpecImpl.conv_];
    }
    local_208.format_ = (UntypedFormatSpecImpl *)CONCAT71(local_208.format_._1_7_,cVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(char *)&local_208,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
    std::__cxx11::stringbuf::str();
    v_00._M_len._1_7_ =
         local_208.args_.storage_.metadata_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value._1_7_;
    v_00._M_len._0_1_ =
         (byte)local_208.args_.storage_.metadata_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
               .super_Storage<unsigned_long,_1UL,_false>.value;
    v_00._M_str = (char *)local_208.format_;
    FormatSinkImpl::Append((this->converter_).sink_,v_00);
    if ((Data *)local_208.format_ != &local_208.args_.storage_.data_) {
      operator_delete(local_208.format_,
                      (ulong)((long)&(local_208.args_.storage_.data_.allocated.allocated_data)->
                                     data_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  return bVar1;
}

Assistant:

bool ConvertOne(const UnboundConversion& conv, string_view conv_string) {
    BoundConversion bound;
    if (!arg_context_.Bind(&conv, &bound)) return false;
    return converter_.ConvertOne(bound, conv_string);
  }